

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  Descriptor *expected;
  bool bVar1;
  uint32_t uVar2;
  CppType CVar3;
  CppStringType CVar4;
  Reflection *pRVar5;
  Descriptor *actual;
  UnknownFieldSet *this_00;
  ExtensionSet *this_01;
  FieldDescriptor *this_02;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<unsigned_long> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<bool> *this_08;
  RepeatedField<int> *pRVar6;
  RepeatedField<absl::lts_20250127::Cord> *this_09;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_10;
  MapFieldBase *this_11;
  RepeatedPtrFieldBase *this_12;
  Cord **ppCVar7;
  Cord *this_13;
  InlinedStringField *this_14;
  MicroString *this_15;
  ArenaStringPtr *this_16;
  string *psVar8;
  Message **ppMVar9;
  size_t sVar10;
  Message *sub_message;
  ArenaStringPtr *str;
  string *ptr;
  FieldDescriptor *field;
  size_t sStack_20;
  int i;
  size_t total_size;
  Message *message_local;
  Reflection *this_local;
  
  pRVar5 = Message::GetReflection(message);
  if (this != pRVar5) {
    expected = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,actual,(FieldDescriptor *)0x0,"SpaceUsedLong");
  }
  uVar2 = internal::ReflectionSchema::GetObjectSize(&this->schema_);
  this_00 = GetUnknownFields(this,message);
  sStack_20 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_00);
  sStack_20 = sStack_20 + uVar2;
  bVar1 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
  if (bVar1) {
    this_01 = GetExtensionSet(this,message);
    sVar10 = internal::ExtensionSet::SpaceUsedExcludingSelfLong(this_01);
    sStack_20 = sVar10 + sStack_20;
  }
  field._4_4_ = 0;
  do {
    if (this->last_non_weak_field_index_ < field._4_4_) {
      return sStack_20;
    }
    this_02 = Descriptor::field(this->descriptor_,field._4_4_);
    bVar1 = FieldDescriptor::is_repeated(this_02);
    if (bVar1) {
      CVar3 = FieldDescriptor::cpp_type(this_02);
      switch(CVar3) {
      case CPPTYPE_INT32:
        pRVar6 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_02);
        sVar10 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar6);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_INT64:
        this_03 = GetRaw<google::protobuf::RepeatedField<long>>(this,message,this_02);
        sVar10 = RepeatedField<long>::SpaceUsedExcludingSelfLong(this_03);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_UINT32:
        this_04 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,this_02);
        sVar10 = RepeatedField<unsigned_int>::SpaceUsedExcludingSelfLong(this_04);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_UINT64:
        this_05 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,this_02);
        sVar10 = RepeatedField<unsigned_long>::SpaceUsedExcludingSelfLong(this_05);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_DOUBLE:
        this_06 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,this_02);
        sVar10 = RepeatedField<double>::SpaceUsedExcludingSelfLong(this_06);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_FLOAT:
        this_07 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,this_02);
        sVar10 = RepeatedField<float>::SpaceUsedExcludingSelfLong(this_07);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_BOOL:
        this_08 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,this_02);
        sVar10 = RepeatedField<bool>::SpaceUsedExcludingSelfLong(this_08);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_ENUM:
        pRVar6 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_02);
        sVar10 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar6);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_STRING:
        CVar4 = FieldDescriptor::cpp_string_type(this_02);
        if (CVar4 == kView) {
LAB_0045f5ae:
          this_10 = GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                              (this,message,this_02);
          sVar10 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::SpaceUsedExcludingSelfLong(this_10);
          sStack_20 = sVar10 + sStack_20;
        }
        else if (CVar4 == kCord) {
          this_09 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,this_02);
          sVar10 = RepeatedField<absl::lts_20250127::Cord>::SpaceUsedExcludingSelfLong(this_09);
          sStack_20 = sVar10 + sStack_20;
        }
        else if (CVar4 == kString) goto LAB_0045f5ae;
        break;
      case CPPTYPE_MESSAGE:
        bVar1 = anon_unknown_6::IsMapFieldInApi(this_02);
        if (bVar1) {
          this_11 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,this_02);
          sVar10 = internal::MapFieldBase::SpaceUsedExcludingSelfLong(this_11);
        }
        else {
          this_12 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,this_02);
          sVar10 = internal::RepeatedPtrFieldBase::
                   SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (this_12);
        }
        sStack_20 = sVar10 + sStack_20;
      }
    }
    else {
      bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,this_02);
      if (((!bVar1) || (bVar1 = HasOneofField(this,message,this_02), bVar1)) &&
         (CVar3 = FieldDescriptor::cpp_type(this_02), 7 < CVar3 - CPPTYPE_INT32)) {
        if (CVar3 == CPPTYPE_STRING) {
          CVar4 = FieldDescriptor::cpp_string_type(this_02);
          if (CVar4 == kView) {
LAB_0045f72d:
            bVar1 = IsInlined(this,this_02);
            if (bVar1) {
              this_14 = GetField<google::protobuf::internal::InlinedStringField>
                                  (this,message,this_02);
              psVar8 = internal::InlinedStringField::GetNoArena_abi_cxx11_(this_14);
              sVar10 = internal::StringSpaceUsedExcludingSelfLong(psVar8);
              sStack_20 = sVar10 + sStack_20;
            }
            else {
              bVar1 = IsMicroString(this,this_02);
              if (bVar1) {
                this_15 = GetField<google::protobuf::internal::MicroString>(this,message,this_02);
                sVar10 = internal::MicroString::SpaceUsedExcludingSelfLong(this_15);
                sStack_20 = sVar10 + sStack_20;
              }
              else {
                this_16 = GetField<google::protobuf::internal::ArenaStringPtr>(this,message,this_02)
                ;
                bVar1 = internal::ArenaStringPtr::IsDefault(this_16);
                if ((!bVar1) ||
                   (bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,this_02), bVar1))
                {
                  psVar8 = internal::ArenaStringPtr::Get_abi_cxx11_(this_16);
                  sVar10 = internal::StringSpaceUsedExcludingSelfLong(psVar8);
                  sStack_20 = sVar10 + 0x20 + sStack_20;
                }
              }
            }
          }
          else if (CVar4 == kCord) {
            bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,this_02);
            if (bVar1) {
              ppCVar7 = GetField<absl::lts_20250127::Cord*>(this,message,this_02);
              sVar10 = absl::lts_20250127::Cord::EstimatedMemoryUsage(*ppCVar7,kTotal);
            }
            else {
              this_13 = GetField<absl::lts_20250127::Cord>(this,message,this_02);
              sVar10 = absl::lts_20250127::Cord::EstimatedMemoryUsage(this_13,kTotal);
              sVar10 = sVar10 - 0x10;
            }
            sStack_20 = sVar10 + sStack_20;
          }
          else if (CVar4 == kString) goto LAB_0045f72d;
        }
        else if ((CVar3 == CPPTYPE_MESSAGE) &&
                (bVar1 = internal::ReflectionSchema::IsDefaultInstance(&this->schema_,message),
                !bVar1)) {
          ppMVar9 = GetRaw<google::protobuf::Message_const*>(this,message,this_02);
          if (*ppMVar9 != (Message *)0x0) {
            sVar10 = Message::SpaceUsedLong(*ppMVar9);
            sStack_20 = sVar10 + sStack_20;
          }
        }
      }
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  STATIC_USAGE_CHECK_MESSAGE(SpaceUsedLong, &message);
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              total_size += GetRaw<RepeatedField<absl::Cord>>(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (schema_.InRealOneof(field)) {
                total_size += GetField<absl::Cord*>(message, field)
                                  ->EstimatedMemoryUsage();

              } else {
                // sizeof(absl::Cord) is included to self.
                total_size += GetField<absl::Cord>(message, field)
                                  .EstimatedMemoryUsage() -
                              sizeof(absl::Cord);
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
              } else if (IsMicroString(field)) {
                total_size += GetField<MicroString>(message, field)
                                  .SpaceUsedExcludingSelfLong();
              } else {
                // Initially, the string points to the default value stored
                // in the prototype. Only count the string if it has been
                // changed from the default value.
                // Except oneof fields, those never point to a default instance,
                // and there is no default instance to point to.
                const auto& str = GetField<ArenaStringPtr>(message, field);
                if (!str.IsDefault() || schema_.InRealOneof(field)) {
                  // string fields are represented by just a pointer, so also
                  // include sizeof(string) as well.
                  total_size += sizeof(std::string) +
                                StringSpaceUsedExcludingSelfLong(str.Get());
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  if (internal::DebugHardenFuzzMessageSpaceUsedLong()) {
    // Use both `this` and `dummy` to generate the seed so that the scale factor
    // is both per-object and non-predictable, but consistent across multiple
    // calls in the same binary.
    static bool dummy;
    uintptr_t seed =
        reinterpret_cast<uintptr_t>(&dummy) ^ reinterpret_cast<uintptr_t>(this);
    // Fuzz the size by +/- 50%.
    double scale = (static_cast<double>(seed % 10000) / 10000) + 0.5;
    return total_size * scale;
  } else {
    return total_size;
  }
}